

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O2

size_t __thiscall
asio::detail::epoll_reactor::
cancel_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,per_timer_data *timer,size_t max_cancelled)

{
  size_t sVar1;
  op_queue<asio::detail::scheduler_operation> ops;
  scoped_lock lock;
  op_queue<asio::detail::scheduler_operation> local_48;
  scoped_lock local_30;
  
  conditionally_enabled_mutex::scoped_lock::scoped_lock(&local_30,&this->mutex_);
  local_48.front_ = (scheduler_operation *)0x0;
  local_48.back_ = (scheduler_operation *)0x0;
  sVar1 = timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel_timer(queue,timer,&local_48,max_cancelled);
  conditionally_enabled_mutex::scoped_lock::unlock(&local_30);
  scheduler::post_deferred_completions(this->scheduler_,&local_48);
  op_queue<asio::detail::scheduler_operation>::~op_queue(&local_48);
  conditionally_enabled_mutex::scoped_lock::~scoped_lock(&local_30);
  return sVar1;
}

Assistant:

std::size_t epoll_reactor::cancel_timer(timer_queue<Time_Traits>& queue,
    typename timer_queue<Time_Traits>::per_timer_data& timer,
    std::size_t max_cancelled)
{
  mutex::scoped_lock lock(mutex_);
  op_queue<operation> ops;
  std::size_t n = queue.cancel_timer(timer, ops, max_cancelled);
  lock.unlock();
  scheduler_.post_deferred_completions(ops);
  return n;
}